

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

EDLines * __thiscall EDLines::drawOnImage(EDLines *this)

{
  double *pdVar1;
  int *in_RSI;
  void *pvVar2;
  long lVar3;
  long lVar4;
  __m128d t;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  _InputArray local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  EDLines *pEStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar2 = *(void **)(in_RSI + 2);
  cv::Mat::Mat((Mat *)this,in_RSI[1],*in_RSI,0,pvVar2,0);
  local_48 = 0;
  local_58 = CONCAT44(local_58._4_4_,0x1010000);
  local_80.sz.width = 0;
  local_80.sz.height = 0;
  local_80.flags = 0x2010000;
  local_80.obj = this;
  pEStack_50 = this;
  cv::cvtColor((cv *)&local_58,&local_80,(_OutputArray *)0x8,0,(int)pvVar2);
  if (0 < in_RSI[0x9c]) {
    lVar4 = 0x10;
    lVar3 = 0;
    local_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0x406fe000;
    do {
      local_80.sz.width = 0;
      local_80.sz.height = 0;
      local_80.flags = 0x3010000;
      pdVar1 = (double *)(*(long *)(in_RSI + 0x96) + -0x10 + lVar4);
      local_88 = (int)ROUND(*pdVar1);
      local_84 = (int)ROUND(pdVar1[1]);
      pdVar1 = (double *)(*(long *)(in_RSI + 0x96) + lVar4);
      local_90 = (int)ROUND(*pdVar1);
      local_8c = (int)ROUND(pdVar1[1]);
      local_58 = CONCAT44(uStack_64,local_68);
      pEStack_50 = (EDLines *)CONCAT44(uStack_5c,uStack_60);
      local_48 = 0;
      uStack_40 = 0;
      local_80.obj = this;
      cv::line(&local_80,&local_88,&local_90,&local_58,1,0x10,0);
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < in_RSI[0x9c]);
  }
  return this;
}

Assistant:

Mat EDLines::drawOnImage()
{
	Mat colorImage = Mat(height, width, CV_8UC1, srcImg);
	cvtColor(colorImage, colorImage, COLOR_GRAY2BGR);
	for (int i = 0; i < linesNo; i++) {
		line(colorImage, linePoints[i].start, linePoints[i].end, Scalar(0, 255, 0), 1, LINE_AA, 0); // draw lines as green on image
	}

	return colorImage;
}